

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O0

DdNode * Cudd_CProjection(DdManager *dd,DdNode *R,DdNode *Y)

{
  int iVar1;
  DdNode *Ysupp;
  DdNode *support;
  DdNode *res;
  DdNode *Y_local;
  DdNode *R_local;
  DdManager *dd_local;
  
  iVar1 = cuddCheckCube(dd,Y);
  if (iVar1 == 0) {
    fprintf((FILE *)dd->err,"Error: The third argument of Cudd_CProjection should be a cube\n");
    dd->errorCode = CUDD_INVALID_ARG;
    dd_local = (DdManager *)0x0;
  }
  else {
    Ysupp = Cudd_Support(dd,Y);
    if (Ysupp == (DdNode *)0x0) {
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)Ysupp & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)Ysupp & 0xfffffffffffffffe) + 4) + 1;
      do {
        dd->reordered = 0;
        dd_local = (DdManager *)cuddCProjectionRecur(dd,R,Y,Ysupp);
      } while (dd->reordered == 1);
      if (dd_local == (DdManager *)0x0) {
        Cudd_RecursiveDeref(dd,Ysupp);
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + 1;
        Cudd_RecursiveDeref(dd,Ysupp);
        *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + -1;
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_CProjection(
  DdManager * dd,
  DdNode * R,
  DdNode * Y)
{
    DdNode *res;
    DdNode *support;

    if (cuddCheckCube(dd,Y) == 0) {
        (void) fprintf(dd->err,
        "Error: The third argument of Cudd_CProjection should be a cube\n");
        dd->errorCode = CUDD_INVALID_ARG;
        return(NULL);
    }

    /* Compute the support of Y, which is used by the abstraction step
    ** in cuddCProjectionRecur.
    */
    support = Cudd_Support(dd,Y);
    if (support == NULL) return(NULL);
    cuddRef(support);

    do {
        dd->reordered = 0;
        res = cuddCProjectionRecur(dd,R,Y,support);
    } while (dd->reordered == 1);

    if (res == NULL) {
        Cudd_RecursiveDeref(dd,support);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd,support);
    cuddDeref(res);

    return(res);

}